

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  ImGuiContext *pIVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pIVar1 = GImGui;
  pcVar2 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
  pcVar4 = text;
  pcVar3 = text;
  if (text < pcVar2) {
    do {
      pcVar4 = pcVar3;
      if (*pcVar3 == '#') {
        if (pcVar3[1] == '#') break;
      }
      else if (*pcVar3 == '\0') break;
      pcVar3 = pcVar3 + 1;
      pcVar4 = pcVar2;
    } while (pcVar3 != pcVar2);
  }
  if (((int)pcVar4 != (int)text) &&
     (RenderTextClippedEx(GImGui->CurrentWindow->DrawList,pos_min,pos_max,text,pcVar4,
                          text_size_if_known,align,clip_rect), pIVar1->LogEnabled == true)) {
    LogRenderedText(pos_min,text,pcVar4);
    return;
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    RenderTextClippedEx(window->DrawList, pos_min, pos_max, text, text_display_end, text_size_if_known, align, clip_rect);
    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_display_end);
}